

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marschner_lobb.hpp
# Opt level: O0

double __thiscall sisl::test::marschner_lobb::operator()(marschner_lobb *this,double d0,...)

{
  Scalar SVar1;
  char in_AL;
  Scalar *pSVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  double extraout_XMM0_Qa;
  Scalar in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  Scalar *local_188;
  Scalar local_118 [4];
  undefined8 local_f8;
  undefined8 local_f0;
  Scalar local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  int local_4c;
  undefined1 local_48 [8];
  vector V;
  va_list vl;
  double d0_local;
  marschner_lobb *this_local;
  
  if (in_AL != '\0') {
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  local_4c = 3;
  local_118[1] = (Scalar)in_RSI;
  local_118[2] = (Scalar)in_RDX;
  local_118[3] = (Scalar)in_RCX;
  local_f8 = in_R8;
  local_f0 = in_R9;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)local_48,&local_4c);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_48,0);
  SVar1 = local_d8;
  *pSVar2 = d0;
  local_188 = (Scalar *)&stack0x00000008;
  V.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ = 0x50;
  V.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._0_4_ = 8;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_48,1);
  *pSVar2 = SVar1;
  if (V.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ < 0xa1
     ) {
    local_188 = (Scalar *)
                ((long)local_118 +
                (long)(int)V.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                           m_storage.m_rows._4_4_);
    V.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ =
         V.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ +
         0x10;
  }
  SVar1 = *local_188;
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)local_48,2);
  *pSVar2 = SVar1;
  (*(this->super_function)._vptr_function[3])(this,local_48);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_48);
  return extraout_XMM0_Qa;
}

Assistant:

virtual const double operator()(double d0, ...) const {
                va_list vl;
                vector V(3);
                V[0] = d0;

                va_start(vl, d0);
                V[1] = va_arg(vl, double);
                V[2] = va_arg(vl, double);
                va_end(vl);

                return (*this)(V);
            }